

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O1

void Curl_hostcache_prune(Curl_easy *data)

{
  time_t tVar1;
  size_t sVar2;
  int iVar3;
  time_t local_48;
  long local_40;
  int local_38;
  
  if ((data->dns).hostcache != (Curl_hash *)0x0) {
    iVar3 = (data->set).dns_cache_timeout;
    if (data->share != (Curl_share *)0x0) {
      Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
    }
    tVar1 = time((time_t *)0x0);
    do {
      local_40 = 0;
      local_48 = tVar1;
      local_38 = iVar3;
      Curl_hash_clean_with_criterium((data->dns).hostcache,&local_48,hostcache_entry_is_stale);
      iVar3 = (int)local_40;
      if (0x7ffffffe < local_40) {
        iVar3 = 0x7ffffffe;
      }
    } while ((iVar3 != 0) && (sVar2 = Curl_hash_count((data->dns).hostcache), 29999 < sVar2));
    if (data->share != (Curl_share *)0x0) {
      Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
    }
  }
  return;
}

Assistant:

void Curl_hostcache_prune(struct Curl_easy *data)
{
  time_t now;
  /* the timeout may be set -1 (forever) */
  int timeout = data->set.dns_cache_timeout;

  if(!data->dns.hostcache)
    /* NULL hostcache means we cannot do it */
    return;

  if(data->share)
    Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

  now = time(NULL);

  do {
    /* Remove outdated and unused entries from the hostcache */
    time_t oldest = hostcache_prune(data->dns.hostcache, timeout, now);

    if(oldest < INT_MAX)
      timeout = (int)oldest; /* we know it fits */
    else
      timeout = INT_MAX - 1;

    /* if the cache size is still too big, use the oldest age as new
       prune limit */
  } while(timeout &&
          (Curl_hash_count(data->dns.hostcache) > MAX_DNS_CACHE_SIZE));

  if(data->share)
    Curl_share_unlock(data, CURL_LOCK_DATA_DNS);
}